

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger thread_wakeup(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQObjectValue v_00;
  SQTable *pSVar4;
  SQObjectPtr *pSVar5;
  SQInteger SVar6;
  SQRESULT SVar7;
  char *err;
  SQObjectPtr o;
  SQObjectPtr local_30;
  
  pSVar5 = SQVM::GetAt(v,v->_stackbase);
  local_30.super_SQObject._type = (pSVar5->super_SQObject)._type;
  v_00 = (SQObjectValue)(pSVar5->super_SQObject)._unVal.pGenerator;
  if ((local_30.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((v_00.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_30.super_SQObject._unVal = v_00;
  if (local_30.super_SQObject._type == OT_THREAD) {
    SVar6 = sq_getvmstate((HSQUIRRELVM)v_00.pTable);
    if (SVar6 == 0) {
      err = "cannot wakeup a idle thread";
    }
    else {
      if (SVar6 != 1) {
        SVar6 = sq_gettop(v);
        if (1 < SVar6) {
          sq_move((HSQUIRRELVM)v_00.pTable,v,2);
        }
        SVar7 = sq_wakeupvm((HSQUIRRELVM)v_00.pTable,(ulong)(1 < SVar6),1,1,0);
        if (SVar7 < 0) {
          sq_settop((HSQUIRRELVM)v_00.pTable,1);
          SVar2 = (v->_lasterror).super_SQObject._type;
          pSVar4 = (v->_lasterror).super_SQObject._unVal.pTable;
          (v->_lasterror).super_SQObject._unVal =
               *(SQObjectValue *)&((v_00.pGenerator)->_ci)._generator;
          SVar3 = ((v_00.pNativeClosure)->_name).super_SQObject._type;
          (v->_lasterror).super_SQObject._type = SVar3;
          if ((SVar3 >> 0x1b & 1) != 0) {
            pSVar1 = &(((v->_lasterror).super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
          }
          SVar7 = -1;
          if ((SVar2 >> 0x1b & 1) != 0) {
            pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 - 1;
            if (*pSVar1 == 0) {
              (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                _vptr_SQRefCounted[2])();
            }
          }
        }
        else {
          sq_move(v,(HSQUIRRELVM)v_00.pTable,-1);
          sq_pop((HSQUIRRELVM)v_00.pTable,1);
          SVar6 = sq_getvmstate((HSQUIRRELVM)v_00.pTable);
          SVar7 = 1;
          if (SVar6 == 0) {
            sq_settop((HSQUIRRELVM)v_00.pTable,1);
          }
        }
        goto LAB_0012c9a3;
      }
      err = "cannot wakeup a running thread";
    }
    SVar7 = sq_throwerror(v,err);
  }
  else {
    SVar7 = sq_throwerror(v,"wrong parameter");
  }
LAB_0012c9a3:
  SQObjectPtr::~SQObjectPtr(&local_30);
  return SVar7;
}

Assistant:

static SQInteger thread_wakeup(HSQUIRRELVM v)
{
    SQObjectPtr o = stack_get(v,1);
    if(sq_type(o) == OT_THREAD) {
        SQVM *thread = _thread(o);
        SQInteger state = sq_getvmstate(thread);
        if(state != SQ_VMSTATE_SUSPENDED) {
            switch(state) {
                case SQ_VMSTATE_IDLE:
                    return sq_throwerror(v,_SC("cannot wakeup a idle thread"));
                break;
                case SQ_VMSTATE_RUNNING:
                    return sq_throwerror(v,_SC("cannot wakeup a running thread"));
                break;
            }
        }

        SQInteger wakeupret = sq_gettop(v)>1?SQTrue:SQFalse;
        if(wakeupret) {
            sq_move(thread,v,2);
        }
        if(SQ_SUCCEEDED(sq_wakeupvm(thread,wakeupret,SQTrue,SQTrue,SQFalse))) {
            sq_move(v,thread,-1);
            sq_pop(thread,1); //pop retval
            if(sq_getvmstate(thread) == SQ_VMSTATE_IDLE) {
                sq_settop(thread,1); //pop roottable
            }
            return 1;
        }
        sq_settop(thread,1);
        v->_lasterror = thread->_lasterror;
        return SQ_ERROR;
    }
    return sq_throwerror(v,_SC("wrong parameter"));
}